

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_shutdown(uv_shutdown_t *req,uv_stream_t *stream,uv_shutdown_cb cb)

{
  anon_union_16_2_bf76bca6_for_active_reqs *paVar1;
  byte *pbVar2;
  int iVar3;
  
  if ((stream->type < UV_UDP) && ((0x5080U >> (stream->type & (UV_SIGNAL|UV_UDP)) & 1) != 0)) {
    iVar3 = -0x6b;
    if ((stream->flags & 0x8303) == 0x8000) {
      if ((stream->io_watcher).fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x4f2,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
      }
      req->type = UV_SHUTDOWN;
      paVar1 = &stream->loop->active_reqs;
      paVar1->count = paVar1->count + 1;
      req->handle = stream;
      req->cb = cb;
      stream->shutdown_req = req;
      pbVar2 = (byte *)((long)&stream->flags + 1);
      *pbVar2 = *pbVar2 | 1;
      uv__io_start(stream->loop,&stream->io_watcher,4);
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("stream->type == UV_TCP || stream->type == UV_TTY || stream->type == UV_NAMED_PIPE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x4e9,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
}

Assistant:

int uv_shutdown(uv_shutdown_t* req, uv_stream_t* stream, uv_shutdown_cb cb) {
  assert(stream->type == UV_TCP ||
         stream->type == UV_TTY ||
         stream->type == UV_NAMED_PIPE);

  if (!(stream->flags & UV_HANDLE_WRITABLE) ||
      stream->flags & UV_HANDLE_SHUT ||
      stream->flags & UV_HANDLE_SHUTTING ||
      uv__is_closing(stream)) {
    return UV_ENOTCONN;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Initialize request */
  uv__req_init(stream->loop, req, UV_SHUTDOWN);
  req->handle = stream;
  req->cb = cb;
  stream->shutdown_req = req;
  stream->flags |= UV_HANDLE_SHUTTING;

  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}